

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_quantizer64(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  uint *in_RSI;
  long in_RDI;
  int *arg;
  long *local_38;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_38 = (long *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_38 = *(long **)(in_RSI + 2);
    *(long **)(in_RSI + 2) = local_38 + 1;
  }
  piVar2 = (int *)*local_38;
  if (piVar2 == (int *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar3 = av1_get_quantizer(*(AV1_COMP **)(*(long *)(in_RDI + 0xb50) + 0x160));
    iVar3 = av1_qindex_to_quantizer(iVar3);
    *piVar2 = iVar3;
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_quantizer64(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  *arg = av1_qindex_to_quantizer(av1_get_quantizer(ctx->ppi->cpi));
  return AOM_CODEC_OK;
}